

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)

{
  FAPOBase *in_RDI;
  int32_t c;
  int32_t i;
  int local_10;
  int local_c;
  
  FAPOBase_Reset(in_RDI);
  DspDelay_Reset((DspDelay *)0x12beb4);
  for (local_c = 0; local_c < 1; local_c = local_c + 1) {
    DspAllPass_Reset((DspAllPass *)0x12bee4);
  }
  for (local_10 = 0; local_10 < *(int *)&in_RDI[1].base.SetParameters; local_10 = local_10 + 1) {
    DspDelay_Reset((DspDelay *)0x12bf32);
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      DspCombShelving_Reset((DspCombShelving *)0x12bf75);
    }
    DspBiQuad_Reset((DspBiQuad *)((long)in_RDI + (long)local_10 * 0x4b0 + 0x5c8));
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      DspAllPass_Reset((DspAllPass *)0x12bff3);
    }
  }
  return;
}

Assistant:

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)
{
	int32_t i, c;
	FAPOBase_Reset(&fapo->base);

	/* Reset the cached state of the reverb filter */
	DspDelay_Reset(&fapo->reverb.early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; i += 1)
	{
		DspAllPass_Reset(&fapo->reverb.apf_in[i]);
	}

	for (c = 0; c < fapo->reverb.reverb_channels; c += 1)
	{
		DspDelay_Reset(&fapo->reverb.channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; i += 1)
		{
			DspCombShelving_Reset(&fapo->reverb.channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&fapo->reverb.channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; i += 1)
		{
			DspAllPass_Reset(&fapo->reverb.channel[c].apf_out[i]);
		}
	}
}